

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O0

Element __thiscall ftxui::MenuBase::Render(MenuBase *this)

{
  bool bVar1;
  size_t sVar2;
  int *piVar3;
  reference box;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  MenuBase *in_RSI;
  Element EVar4;
  char *local_220;
  code *local_218;
  code *local_210;
  MenuOption *local_200;
  MenuOption *local_1f0;
  MenuOption *local_1e0;
  bool local_1c9;
  vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> local_180;
  Decorator local_168;
  Decorator local_148;
  function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> local_128;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  Element local_c8;
  Element local_b8;
  Element local_a8;
  value_type local_98;
  char *local_88;
  char *icon;
  _func_Element_Element *focus_management;
  Decorator style;
  bool is_selected;
  size_t sStack_50;
  bool is_focused;
  size_t i;
  undefined1 local_30 [7];
  bool is_menu_focused;
  Elements elements;
  MenuBase *this_local;
  
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::vector
            ((vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> *
             )local_30);
  bVar1 = ComponentBase::Focused(&in_RSI->super_ComponentBase);
  sVar2 = ConstStringListRef::size(&in_RSI->entries_);
  std::vector<ftxui::Box,_std::allocator<ftxui::Box>_>::resize(&in_RSI->boxes_,sVar2);
  sStack_50 = 0;
  while( true ) {
    sVar2 = ConstStringListRef::size(&in_RSI->entries_);
    if (sVar2 <= sStack_50) break;
    piVar3 = focused_entry(in_RSI);
    local_1c9 = false;
    if (*piVar3 == (int)sStack_50) {
      local_1c9 = bVar1;
    }
    style._M_invoker._7_1_ = local_1c9;
    style._M_invoker._6_1_ = *in_RSI->selected_ == (int)sStack_50;
    if ((bool)style._M_invoker._6_1_) {
      if (local_1c9 == false) {
        local_1e0 = Ref<ftxui::MenuOption>::operator->(&in_RSI->option_);
        local_1e0 = (MenuOption *)&local_1e0->style_selected;
      }
      else {
        local_1e0 = Ref<ftxui::MenuOption>::operator->(&in_RSI->option_);
        local_1e0 = (MenuOption *)&local_1e0->style_selected_focused;
      }
      local_1f0 = local_1e0;
    }
    else {
      if (local_1c9 == false) {
        local_200 = Ref<ftxui::MenuOption>::operator->(&in_RSI->option_);
      }
      else {
        local_200 = Ref<ftxui::MenuOption>::operator->(&in_RSI->option_);
        local_200 = (MenuOption *)&local_200->style_focused;
      }
      local_1f0 = local_200;
    }
    std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::function
              ((function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> *)
               &focus_management,&local_1f0->style_normal);
    if ((style._M_invoker._6_1_ & 1) == 0) {
      local_210 = nothing;
    }
    else {
      if (bVar1) {
        local_218 = focus;
      }
      else {
        local_218 = select;
      }
      local_210 = local_218;
    }
    icon = (char *)local_210;
    if ((style._M_invoker._6_1_ & 1) == 0) {
      local_220 = "  ";
    }
    else {
      local_220 = "> ";
    }
    local_88 = local_220;
    ConstStringListRef::operator[][abi_cxx11_(&local_108,&in_RSI->entries_,sStack_50);
    std::operator+(&local_e8,local_220,&local_108);
    text((ftxui *)&local_c8,&local_e8);
    std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::function
              (&local_128,
               (function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> *)
               &focus_management);
    operator|((ftxui *)&local_b8,&local_c8,&local_128);
    std::function<std::shared_ptr<ftxui::Node>(std::shared_ptr<ftxui::Node>)>::
    function<std::shared_ptr<ftxui::Node>(*&)(std::shared_ptr<ftxui::Node>),void>
              ((function<std::shared_ptr<ftxui::Node>(std::shared_ptr<ftxui::Node>)> *)&local_148,
               (_func_shared_ptr<ftxui::Node>_shared_ptr<ftxui::Node> **)&icon);
    operator|((ftxui *)&local_a8,&local_b8,&local_148);
    box = std::vector<ftxui::Box,_std::allocator<ftxui::Box>_>::operator[]
                    (&in_RSI->boxes_,sStack_50);
    reflect(&local_168,box);
    operator|((ftxui *)&local_98,&local_a8,&local_168);
    std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::
    push_back((vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
               *)local_30,&local_98);
    std::shared_ptr<ftxui::Node>::~shared_ptr(&local_98);
    std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::~function
              (&local_168);
    std::shared_ptr<ftxui::Node>::~shared_ptr(&local_a8);
    std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::~function
              (&local_148);
    std::shared_ptr<ftxui::Node>::~shared_ptr(&local_b8);
    std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::~function
              (&local_128);
    std::shared_ptr<ftxui::Node>::~shared_ptr(&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::~function
              ((function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> *)
               &focus_management);
    sStack_50 = sStack_50 + 1;
  }
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::vector
            (&local_180,
             (vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> *
             )local_30);
  vbox((ftxui *)this,&local_180);
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            (&local_180);
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            ((vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> *
             )local_30);
  EVar4.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar4.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Element)EVar4.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element Render() {
    Elements elements;
    bool is_menu_focused = Focused();
    boxes_.resize(entries_.size());
    for (size_t i = 0; i < entries_.size(); ++i) {
      bool is_focused = (focused_entry() == int(i)) && is_menu_focused;
      bool is_selected = (*selected_ == int(i));

      auto style = is_selected ? (is_focused ? option_->style_selected_focused
                                             : option_->style_selected)
                               : (is_focused ? option_->style_focused
                                             : option_->style_normal);
      auto focus_management = !is_selected      ? nothing
                              : is_menu_focused ? focus
                                                : select;
      auto icon = is_selected ? "> " : "  ";
      elements.push_back(text(icon + entries_[i]) | style | focus_management |
                         reflect(boxes_[i]));
    }
    return vbox(std::move(elements));
  }